

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberInvert_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint8_t *uar;
  int32_t iVar1;
  uint uVar2;
  int len;
  byte bVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  
  if ((rhs->exponent == 0) && (rhs->bits < 0x10)) {
    uVar2 = rhs->digits;
    if ((long)(int)uVar2 < 0x32) {
      uVar2 = (uint)""[(int)uVar2];
    }
    puVar4 = rhs->lsu;
    uar = res->lsu;
    uVar6 = (ulong)set->digits;
    if ((long)uVar6 < 0x32) {
      uVar6 = (ulong)""[uVar6];
    }
    puVar5 = puVar4 + ((ulong)uVar2 - 1);
    len = 0;
    for (puVar7 = uar; puVar7 <= uar + (uVar6 - 1); puVar7 = puVar7 + 1) {
      if (puVar5 < puVar4) {
        bVar3 = 0;
      }
      else {
        bVar3 = *puVar4;
      }
      *puVar7 = ~bVar3 & 1;
      if (1 < bVar3 % 10) goto LAB_00251809;
      puVar4 = puVar4 + 1;
      len = len + 1;
    }
    iVar1 = decGetDigits(uar,len);
    res->digits = iVar1;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
LAB_00251809:
    decStatus(res,0x80,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberInvert(decNumber *res, const decNumber *rhs,
                            decContext *set) {
  const Unit *ua, *msua;                /* -> operand and its msu  */
  Unit  *uc, *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  if (rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }
  /* operand is valid  */
  ua=rhs->lsu;                          /* bottom-up  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, uc++) {        /* Unit loop  */
    Unit a;                             /* extract unit  */
    Int  i, j;                          /* work  */
    if (ua>msua) a=0;
     else a=*ua;
    *uc=0;                              /* can now write back  */
    /* always need to examine all bits in rhs  */
    /* This loop could be unrolled and/or use BIN2BCD tables  */
    for (i=0; i<DECDPUN; i++) {
      if ((~a)&1) *uc=*uc+(Unit)powers[i];   /* effect INVERT  */
      j=a%10;
      a=a/10;
      if (j>1) {
        decStatus(res, DEC_Invalid_operation, set);
        return res;
        }
      if (uc==msuc && i==msudigs-1) break;   /* just did final digit  */
      } /* each digit  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }